

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

tuple<long,_double,_double> * __thiscall
fasttext::FastText::progressInfo(FastText *this,real progress)

{
  __int_type_conflict _Var1;
  tuple<double,_double,_long> *in_RDI;
  float in_XMM0_Da;
  double dVar2;
  int64_t eta;
  double wst;
  double lr;
  double t;
  tuple<double,_double,_long> *in_stack_ffffffffffffff78;
  tuple<long,_double,_double> *in_stack_ffffffffffffff80;
  tuple<double,_double,_long> *this_00;
  
  this_00 = in_RDI;
  std::chrono::_V2::steady_clock::now();
  dVar2 = utils::getDuration((time_point *)this_00,(time_point *)in_RDI);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b9af3);
  if ((0.0 < in_XMM0_Da) && (0.0 <= dVar2)) {
    _Var1 = std::__atomic_base::operator_cast_to_long((__atomic_base<long> *)in_RDI);
    in_stack_ffffffffffffff80 = (tuple<long,_double,_double> *)((double)_Var1 / dVar2);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b9bac);
  }
  std::tuple<double,_double,_long>::tuple<double_&,_double_&,_long_&,_true,_true>
            (this_00,(double *)in_RDI,(double *)in_stack_ffffffffffffff80,
             (long *)in_stack_ffffffffffffff78);
  std::tuple<long,_double,_double>::tuple<double,_double,_long,_true,_true>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return (tuple<long,_double,_double> *)this_00;
}

Assistant:

std::tuple<int64_t, double, double> FastText::progressInfo(real progress) {
  double t = utils::getDuration(start_, std::chrono::steady_clock::now());
  double lr = args_->lr * (1.0 - progress);
  double wst = 0;

  int64_t eta = 2592000; // Default to one month in seconds (720 * 3600)

  if (progress > 0 && t >= 0) {
    eta = t * (1 - progress) / progress;
    wst = double(tokenCount_) / t / args_->thread;
  }

  return std::tuple<double, double, int64_t>(wst, lr, eta);
}